

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O1

int __thiscall deqp::gles2::LimitTests::init(LimitTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  int extraout_EAX;
  TestNode *node;
  long lVar2;
  
  lVar2 = 0x10;
  do {
    node = (TestNode *)operator_new(0x78);
    uVar1 = *(undefined4 *)((long)&init::getIntCases[0].name + lVar2);
    tcu::TestCase::TestCase
              ((TestCase *)node,((this->super_TestCaseGroup).m_context)->m_testCtx,
               NODETYPE_CAPABILITY,*(char **)((long)&PTR_typeinfo_00781e50 + lVar2),
               *(char **)(&UNK_00781e58 + lVar2));
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781f60;
    *(undefined4 *)&node[1]._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,node);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x100);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		static const struct
		{
			const char*		name;
			const char*		description;
			GLenum			param;
		} getIntCases[] =
		{
			{ "vertex_attribs",					"Number of vertex attributes supported",							GL_MAX_VERTEX_ATTRIBS					},
			{ "varying_vectors",				"Number of varying vectors supported",								GL_MAX_VARYING_VECTORS					},
			{ "vertex_uniform_vectors",			"Number of vertex uniform vectors supported",						GL_MAX_VERTEX_UNIFORM_VECTORS			},
			{ "fragment_uniform_vectors",		"Number of fragment uniform vectors supported",						GL_MAX_FRAGMENT_UNIFORM_VECTORS			},
			{ "texture_image_units",			"Number of fragment texture units supported",						GL_MAX_TEXTURE_IMAGE_UNITS				},
			{ "vertex_texture_image_units",		"Number of vertex texture units supported",							GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS		},
			{ "combined_texture_image_units",	"Number of vertex and fragment combined texture units supported",	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS		},
			{ "texture_2d_size",				"Maximum 2D texture size",											GL_MAX_TEXTURE_SIZE						},
			{ "texture_cube_size",				"Maximum cubemap texture size",										GL_MAX_CUBE_MAP_TEXTURE_SIZE			},
			{ "renderbuffer_size",				"Maximum renderbuffer size",										GL_MAX_RENDERBUFFER_SIZE				},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(getIntCases); ndx++)
			addChild(new GetIntCase(m_context, getIntCases[ndx].name, getIntCases[ndx].description, getIntCases[ndx].param));
	}